

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O1

int verify_monster(void *buffer)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  MyGame_Example_Monster_table_t pMVar6;
  flatbuffers_string_t pcVar7;
  ulong uVar8;
  MyGame_Example_Monster_table_t t__tmp;
  ulong uVar9;
  char *__s;
  flatbuffers_uoffset_t *elem__tmp;
  
  if ((buffer == (void *)0x0) || (*(int *)((long)buffer + 4) != 0x534e4f4d)) {
    t__tmp = (MyGame_Example_Monster_table_t)0x0;
  }
  else {
    t__tmp = (MyGame_Example_Monster_table_t)((ulong)*buffer + (long)buffer);
  }
  if (t__tmp == (MyGame_Example_Monster_table_t)0x0) {
    __s = "Monster not available";
  }
  else {
    lVar5 = -(long)*(int *)t__tmp;
    uVar4 = 0;
    if (9 < *(ushort *)(t__tmp + -(long)*(int *)t__tmp)) {
      uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 8);
    }
    if ((uVar4 == 0) || (*(short *)(t__tmp + uVar4) != 0x50)) {
      __s = "Health points are not as expected";
    }
    else {
      if (*(ushort *)(t__tmp + -(long)*(int *)t__tmp) < 6) {
        uVar1 = 0;
      }
      else {
        uVar1 = *(ushort *)(t__tmp + lVar5 + 4);
      }
      if ((t__tmp == (MyGame_Example_Monster_table_t)0x0) || (uVar1 == 0)) {
        __s = "Position is absent";
      }
      else {
        pMVar6 = t__tmp + uVar1;
        if (((int)pMVar6 - (int)buffer & 0xfU) == 0) {
          if ((*(float *)pMVar6 != 1.0) || (NAN(*(float *)pMVar6))) {
            __s = "Position failing on x coordinate";
          }
          else if ((*(float *)(pMVar6 + 4) != 2.0) || (NAN(*(float *)(pMVar6 + 4)))) {
            __s = "Position failing on y coordinate";
          }
          else if ((*(float *)(pMVar6 + 8) != 3.0) || (NAN(*(float *)(pMVar6 + 8)))) {
            __s = "Position failing on z coordinate";
          }
          else if ((*(double *)(pMVar6 + 0x10) != 3.0) || (NAN(*(double *)(pMVar6 + 0x10)))) {
            __s = "Vec3 test1 is not 3";
          }
          else if (pMVar6[0x18].unused__ == '\x02') {
            if ((*(short *)(pMVar6 + 0x1a) == 5) && (pMVar6[0x1c].unused__ == '\x06')) {
              pcVar7 = MyGame_Example_Monster_name(t__tmp);
              if (*(int *)(pcVar7 + -4) == 9) {
                iVar3 = strcmp(pcVar7,"MyMonster");
                if (iVar3 == 0) {
                  lVar5 = -(long)*(int *)t__tmp;
                  uVar1 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
                  if (uVar1 < 0x10) {
                    uVar2 = 0;
                  }
                  else {
                    uVar2 = *(ushort *)(t__tmp + lVar5 + 0xe);
                  }
                  if (uVar2 == 0) {
                    pMVar6 = (MyGame_Example_Monster_table_t)0x0;
                  }
                  else {
                    pMVar6 = t__tmp + (ulong)*(uint *)(t__tmp + uVar2) + (ulong)uVar2 + 4;
                  }
                  if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                     (*(int *)(pMVar6 + -4) != 5)) {
                    __s = "Inventory has wrong length";
                  }
                  else {
                    uVar9 = 0;
                    do {
                      if (pMVar6 == (MyGame_Example_Monster_table_t)0x0) {
                        uVar8 = 0;
                      }
                      else {
                        uVar8 = (ulong)*(uint *)(pMVar6 + -4);
                      }
                      if (uVar8 <= uVar9) {
                        __assert_fail("flatbuffers_vec_len(vec__tmp) > (i__tmp) && \"index out of range\""
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/flatc_compat/generated/flatbuffers_common_reader.h"
                                      ,0x1d8,
                                      "uint8_t flatbuffers_uint8_vec_at(flatbuffers_uint8_vec_t, size_t)"
                                     );
                      }
                      if (uVar9 != pMVar6[uVar9].unused__) {
                        printf("Inventory item #%d is wrong\n");
                        return -1;
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar9 != 5);
                    if (uVar1 < 0x1a) {
                      uVar2 = 0;
                    }
                    else {
                      uVar2 = *(ushort *)(t__tmp + lVar5 + 0x18);
                    }
                    if (uVar2 == 0) {
                      pMVar6 = (MyGame_Example_Monster_table_t)0x0;
                    }
                    else {
                      pMVar6 = t__tmp + (ulong)*(uint *)(t__tmp + uVar2) + (ulong)uVar2 + 4;
                    }
                    if (pMVar6 == (MyGame_Example_Monster_table_t)0x0) {
                      __s = "Array of string not present";
                    }
                    else if (*(uint *)(pMVar6 + -4) == 2) {
                      iVar3 = strcmp((char *)(pMVar6 + (ulong)*(uint *)pMVar6 + 4),"test1");
                      if (iVar3 == 0) {
                        iVar3 = strcmp((char *)(pMVar6 + (ulong)*(uint *)(pMVar6 + 4) + 8),"test2");
                        if (iVar3 == 0) {
                          uVar4 = 0;
                          if (0x13 < uVar1) {
                            uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x12);
                          }
                          if ((uVar4 == 0) || (t__tmp[uVar4].unused__ != '\x01')) {
                            __s = "Not any monster";
                          }
                          else {
                            if (uVar1 < 0x16) {
                              uVar1 = 0;
                            }
                            else {
                              uVar1 = *(ushort *)(t__tmp + lVar5 + 0x14);
                            }
                            if (uVar1 == 0) {
                              pMVar6 = (MyGame_Example_Monster_table_t)0x0;
                            }
                            else {
                              pMVar6 = t__tmp + (ulong)*(uint *)(t__tmp + uVar1) + (ulong)uVar1;
                            }
                            if (pMVar6 == (MyGame_Example_Monster_table_t)0x0) {
                              __s = "test monster not there";
                            }
                            else {
                              pcVar7 = MyGame_Example_Monster_name(pMVar6);
                              iVar3 = strcmp(pcVar7,"Fred");
                              if (iVar3 == 0) {
                                lVar5 = -(long)*(int *)t__tmp;
                                uVar1 = *(ushort *)(t__tmp + -(long)*(int *)t__tmp);
                                if (uVar1 < 0x18) {
                                  uVar2 = 0;
                                }
                                else {
                                  uVar2 = *(ushort *)(t__tmp + lVar5 + 0x16);
                                }
                                if (uVar2 == 0) {
                                  pMVar6 = (MyGame_Example_Monster_table_t)0x0;
                                }
                                else {
                                  pMVar6 = t__tmp + (ulong)*(uint *)(t__tmp + uVar2) + (ulong)uVar2
                                                    + 4;
                                }
                                if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                                   (*(int *)(pMVar6 + -4) != 2)) {
                                  __s = "Test struct vector has wrong length";
                                }
                                else {
                                  if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                                     (*(int *)(pMVar6 + -4) == 0)) {
LAB_00102877:
                                    __assert_fail("flatbuffers_vec_len(vec) > (i) && \"index out of range\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O1/test/flatc_compat/generated/monster_test_reader.h"
                                                  ,0x299,
                                                  "MyGame_Example_Test_struct_t MyGame_Example_Test_vec_at(MyGame_Example_Test_vec_t, size_t)"
                                                 );
                                  }
                                  if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                                     (*(short *)pMVar6 != 10)) {
                                    __s = "Testvec[0].a is wrong";
                                  }
                                  else if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                                          (pMVar6[2].unused__ != '\x14')) {
                                    __s = "Testvec[0].b is wrong";
                                  }
                                  else {
                                    if ((pMVar6 == (MyGame_Example_Monster_table_t)0x0) ||
                                       (*(uint *)(pMVar6 + -4) < 2)) goto LAB_00102877;
                                    if (*(short *)(pMVar6 + 4) == 0x1e) {
                                      if (pMVar6[6].unused__ == '(') {
                                        uVar4 = 0;
                                        if (0x25 < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x24);
                                        }
                                        if ((uVar4 == 0) ||
                                           (*(int *)(t__tmp + uVar4) != -0x228636bf)) {
                                          __assert_fail(
                                                  "ns(Monster_testhashs32_fnv1(monster)) == -579221183L"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x94,"int verify_monster(void *)");
                                        }
                                        uVar4 = 0;
                                        if (0x27 < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x26);
                                        }
                                        if ((uVar4 == 0) ||
                                           (*(int *)(t__tmp + uVar4) != -0x228636bf)) {
                                          __assert_fail(
                                                  "ns(Monster_testhashu32_fnv1(monster)) == 3715746113L"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x95,"int verify_monster(void *)");
                                        }
                                        uVar4 = 0;
                                        if (0x29 < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x28);
                                        }
                                        if ((uVar4 == 0) ||
                                           (*(long *)(t__tmp + uVar4) != 0x6e0f80cdf27b9181)) {
                                          __assert_fail(
                                                  "ns(Monster_testhashs64_fnv1(monster)) == 7930699090847568257LL"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x96,"int verify_monster(void *)");
                                        }
                                        uVar4 = 0;
                                        if (0x2b < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x2a);
                                        }
                                        if ((uVar4 == 0) ||
                                           (*(long *)(t__tmp + uVar4) != 0x6e0f80cdf27b9181)) {
                                          __assert_fail(
                                                  "ns(Monster_testhashu64_fnv1(monster)) == 7930699090847568257LL"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x97,"int verify_monster(void *)");
                                        }
                                        uVar4 = 0;
                                        if (0x2d < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x2c);
                                        }
                                        if ((uVar4 == 0) ||
                                           (*(int *)(t__tmp + uVar4) != -0x717e5b8f)) {
                                          __assert_fail(
                                                  "ns(Monster_testhashs32_fnv1a(monster)) == -1904106383L"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x98,"int verify_monster(void *)");
                                        }
                                        uVar4 = 0;
                                        if (0x2f < uVar1) {
                                          uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x2e);
                                        }
                                        if ((uVar4 != 0) &&
                                           (*(int *)(t__tmp + uVar4) == -0x717e5b8f)) {
                                          uVar4 = 0;
                                          if (0x31 < uVar1) {
                                            uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x30);
                                          }
                                          if ((uVar4 != 0) &&
                                             (*(long *)(t__tmp + uVar4) == 0x43f948dcc767ddf1)) {
                                            uVar4 = 0;
                                            if (0x33 < uVar1) {
                                              uVar4 = (uint)*(ushort *)(t__tmp + lVar5 + 0x32);
                                            }
                                            if ((uVar4 != 0) &&
                                               (*(long *)(t__tmp + uVar4) == 0x43f948dcc767ddf1)) {
                                              return 0;
                                            }
                                            __assert_fail(
                                                  "ns(Monster_testhashu64_fnv1a(monster)) == 4898026182817603057LL"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x9b,"int verify_monster(void *)");
                                          }
                                          __assert_fail(
                                                  "ns(Monster_testhashs64_fnv1a(monster)) == 4898026182817603057LL"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x9a,"int verify_monster(void *)");
                                        }
                                        __assert_fail(
                                                  "ns(Monster_testhashu32_fnv1a(monster)) == 2390860913L"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/flatc_compat/flatc_compat.c"
                                                  ,0x99,"int verify_monster(void *)");
                                      }
                                      __s = "Testvec[1].b is wrong";
                                    }
                                    else {
                                      __s = "Testvec[1].a is wrong";
                                    }
                                  }
                                }
                              }
                              else {
                                __s = "test monster isn\'t Fred";
                              }
                            }
                          }
                        }
                        else {
                          __s = "Second string array element is wrong";
                        }
                      }
                      else {
                        __s = "First string array element is wrong";
                      }
                    }
                    else {
                      __s = "Array of string has wrong vector length";
                    }
                  }
                }
                else {
                  __s = "Name is not correct";
                }
              }
              else {
                __s = "Name length is not correct";
              }
            }
            else {
              __s = "test3 not valid in Vec3";
            }
          }
          else {
            __s = "Vec3 test2 not Green";
          }
        }
        else {
          __s = "Force align of Vec3 struct not correct";
        }
      }
    }
  }
  puts(__s);
  return -1;
}

Assistant:

int verify_monster(void *buffer)
{
    ns(Monster_table_t) monster, mini;
    ns(Vec3_struct_t) vec;
    ns(Test_struct_t) test;
    ns(Test_vec_t) testvec;
    ns(Any_union_type_t) mini_type;
    flatbuffers_string_t name;
    size_t offset;
    flatbuffers_uint8_vec_t inv;
    flatbuffers_string_vec_t aofs;
    flatbuffers_string_t s;
    size_t i;

    if (!(monster = ns(Monster_as_root(buffer)))) {
        printf("Monster not available\n");
        return -1;
    }
    if (ns(Monster_hp(monster)) != 80) {
        printf("Health points are not as expected\n");
        return -1;
    }
    if (!(vec = ns(Monster_pos(monster)))) {
        printf("Position is absent\n");
        return -1;
    }
    offset = (size_t)((char *)vec - (char *)buffer);
    if (offset & 15) {
        printf("Force align of Vec3 struct not correct\n");
        return -1;
    }
    if (ns(Vec3_x(vec)) != 1) {
        printf("Position failing on x coordinate\n");
        return -1;
    }
    if (ns(Vec3_y(vec)) != 2) {
        printf("Position failing on y coordinate\n");
        return -1;
    }
    if (ns(Vec3_z(vec)) != 3) {
        printf("Position failing on z coordinate\n");
        return -1;
    }
    if (ns(Vec3_test1(vec)) != 3) {
        printf("Vec3 test1 is not 3\n");
        return -1;
    }
    if (ns(Vec3_test2(vec)) != ns(Color_Green)) {
        printf("Vec3 test2 not Green\n");
        return -1;
    }
    test = ns(Vec3_test3(vec));
    if (ns(Test_a(test)) != 5 || ns(Test_b(test) != 6)) {
        printf("test3 not valid in Vec3\n");
        return -1;
    }
    name = ns(Monster_name(monster));
    if (flatbuffers_string_len(name) != 9) {
        printf("Name length is not correct\n");
        return -1;
    }
    if (!name || strcmp(name, "MyMonster")) {
        printf("Name is not correct\n");
        return -1;
    }
    inv = ns(Monster_inventory(monster));
    if (flatbuffers_uint8_vec_len(inv) != 5) {
        printf("Inventory has wrong length\n");
        return -1;
    }
    for (i = 0; i < 5; ++i) {
        if (flatbuffers_uint8_vec_at(inv, i) != i) {
            printf("Inventory item #%d is wrong\n", (int)i);
            return -1;
        }
    }
    if (!(aofs = ns(Monster_testarrayofstring(monster)))) {
        printf("Array of string not present\n");
        return -1;
    }
    if (flatbuffers_string_vec_len(aofs) != 2) {
        printf("Array of string has wrong vector length\n");
        return -1;
    }
    s = flatbuffers_string_vec_at(aofs, 0);
    if (strcmp(s, "test1")) {
        printf("First string array element is wrong\n");
        return -1;
    }
    s = flatbuffers_string_vec_at(aofs, 1);
    if (strcmp(s, "test2")) {
        printf("Second string array element is wrong\n");
        return -1;
    }
    mini_type = ns(Monster_test_type(monster));
    if (mini_type != ns(Any_Monster)) {
        printf("Not any monster\n");
        return -1;
    }
    mini = ns(Monster_test(monster));
    if (!mini) {
        printf("test monster not there\n");
        return -1;
    }
    if (strcmp(ns(Monster_name(mini)), "Fred")) {
        printf("test monster isn't Fred\n");
        return -1;
    }
    testvec = ns(Monster_test4(monster));
    if (ns(Test_vec_len(testvec)) != 2) {
        printf("Test struct vector has wrong length\n");
        return -1;
    }
    test = ns(Test_vec_at(testvec, 0));
    if (ns(Test_a(test) != 10)) {
        printf("Testvec[0].a is wrong\n");
        return -1;
    }
    if (ns(Test_b(test) != 20)) {
        printf("Testvec[0].b is wrong\n");
        return -1;
    }
    test = ns(Test_vec_at(testvec, 1));
    if (ns(Test_a(test) != 30)) {
        printf("Testvec[1].a is wrong\n");
        return -1;
    }
    if (ns(Test_b(test) != 40)) {
        printf("Testvec[1].b is wrong\n");
        return -1;
    }
    assert(ns(Monster_testhashs32_fnv1(monster)) == -579221183L);
    assert(ns(Monster_testhashu32_fnv1(monster)) == 3715746113L);
    assert(ns(Monster_testhashs64_fnv1(monster)) == 7930699090847568257LL);
    assert(ns(Monster_testhashu64_fnv1(monster)) == 7930699090847568257LL);
    assert(ns(Monster_testhashs32_fnv1a(monster)) == -1904106383L);
    assert(ns(Monster_testhashu32_fnv1a(monster)) ==  2390860913L);
    assert(ns(Monster_testhashs64_fnv1a(monster)) ==  4898026182817603057LL);
    assert(ns(Monster_testhashu64_fnv1a(monster)) ==  4898026182817603057LL);
    return 0;
}